

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

HRESULT __thiscall
Js::ScriptContext::RecreateNativeCodeGenerator
          (ScriptContext *this,NativeCodeGenerator **previousCodeGen)

{
  NativeCodeGenerator *nativeCodeGen;
  NativeCodeGenerator *pNativeCodeGen;
  AutoNestedHandledExceptionType local_2c [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  nativeCodeGen = this->nativeCodeGen;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType(local_2c,ExceptionType_OutOfMemory)
  ;
  pNativeCodeGen = NewNativeCodeGenerator(this);
  this->nativeCodeGen = pNativeCodeGen;
  SetProfileModeNativeCodeGen(pNativeCodeGen,0);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_2c);
  CloseNativeCodeGenerator(nativeCodeGen);
  if (previousCodeGen == (NativeCodeGenerator **)0x0) {
    DeleteNativeCodeGenerator(nativeCodeGen);
  }
  else {
    *previousCodeGen = nativeCodeGen;
  }
  return 0;
}

Assistant:

HRESULT ScriptContext::RecreateNativeCodeGenerator(NativeCodeGenerator ** previousCodeGen)
    {
        NativeCodeGenerator* oldCodeGen = this->nativeCodeGen;

        HRESULT hr = S_OK;
        BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
        this->nativeCodeGen = NewNativeCodeGenerator(this);
        SetProfileModeNativeCodeGen(this->GetNativeCodeGenerator(), this->IsProfiling());
        END_TRANSLATE_OOM_TO_HRESULT(hr);

        // Delete the native code generator and recreate so that all jobs get cleared properly
        // and re-jitted.
        CloseNativeCodeGenerator(oldCodeGen);
        if (previousCodeGen == nullptr)
        {
            DeleteNativeCodeGenerator(oldCodeGen);
        }
        else
        {
            *previousCodeGen = oldCodeGen;
        }

        return hr;
    }